

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O1

SyntaxPrinter * __thiscall slang::syntax::SyntaxPrinter::print(SyntaxPrinter *this,Trivia trivia)

{
  char cVar1;
  Token *pTVar2;
  SyntaxNode *pSVar3;
  Trivia *pTVar4;
  undefined8 uVar5;
  Trivia *t;
  Token *pTVar6;
  Trivia *pTVar7;
  span<const_slang::parsing::Token,_18446744073709551615UL> sVar8;
  string_view text;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar9;
  anon_union_12_4_39e54f29_for_Trivia_0 local_38;
  TriviaKind TStack_2b;
  Token local_28;
  
  uVar5 = trivia._8_8_;
  local_38.rawText.ptr = (char *)trivia.field_0._0_8_;
  TStack_2b = trivia.kind;
  unique0x100001a8 = uVar5;
  switch(TStack_2b) {
  case LineComment:
  case BlockComment:
    cVar1 = this->includeComments;
    break;
  case DisabledText:
    cVar1 = this->includeSkipped;
    break;
  case SkippedTokens:
    if (this->includeSkipped != true) {
      return this;
    }
    sVar8 = parsing::Trivia::getSkippedTokens((Trivia *)&local_38);
    pTVar2 = sVar8._M_ptr;
    if (sVar8._M_extent._M_extent_value._M_extent_value == 0) {
      return this;
    }
    pTVar6 = pTVar2 + sVar8._M_extent._M_extent_value._M_extent_value;
    do {
      print(this,*pTVar2);
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != pTVar6);
    return this;
  case SkippedSyntax:
    if (this->includeSkipped != true) {
      return this;
    }
    goto LAB_00225752;
  case Directive:
    if (this->includeDirectives != true) {
      if (this->includePreprocessed != true) {
        return this;
      }
      pSVar3 = parsing::Trivia::syntax((Trivia *)&local_38);
      local_28 = SyntaxNode::getFirstToken(pSVar3);
      sVar9 = parsing::Token::trivia(&local_28);
      pTVar4 = sVar9._M_ptr;
      if (sVar9._M_extent._M_extent_value._M_extent_value == 0) {
        return this;
      }
      pTVar7 = pTVar4 + sVar9._M_extent._M_extent_value._M_extent_value;
      do {
        print(this,*pTVar4);
        pTVar4 = pTVar4 + 1;
      } while (pTVar4 != pTVar7);
      return this;
    }
LAB_00225752:
    pSVar3 = parsing::Trivia::syntax((Trivia *)&local_38);
    print(this,pSVar3);
    return this;
  default:
    goto switchD_00225682_default;
  }
  if (cVar1 == '\x01') {
switchD_00225682_default:
    text = parsing::Trivia::getRawText((Trivia *)&local_38);
    append(this,text);
  }
  return this;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::print(Trivia trivia) {
    switch (trivia.kind) {
        case TriviaKind::Directive:
            if (includeDirectives)
                print(*trivia.syntax());
            else if (includePreprocessed) {
                auto nestedTrivia = trivia.syntax()->getFirstToken().trivia();
                for (const auto& t : nestedTrivia)
                    print(t);
            }
            break;
        case TriviaKind::SkippedSyntax:
            if (includeSkipped)
                print(*trivia.syntax());
            break;
        case TriviaKind::SkippedTokens:
            if (includeSkipped) {
                for (Token t : trivia.getSkippedTokens())
                    print(t);
            }
            break;
        case TriviaKind::DisabledText:
            if (includeSkipped)
                append(trivia.getRawText());
            break;
        case TriviaKind::LineComment:
        case TriviaKind::BlockComment:
            if (!includeComments)
                break;
            [[fallthrough]];
        default:
            append(trivia.getRawText());
            break;
    }
    return *this;
}